

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void fmt::v5::vprint(FILE *f,wstring_view format_str,wformat_args args)

{
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined **local_808;
  undefined1 *local_800;
  size_t local_7f8;
  undefined8 local_7f0;
  undefined1 local_7e8 [2000];
  
  local_7f8 = 0;
  local_808 = &PTR_grow_00183cd0;
  local_7f0 = 500;
  local_800 = local_7e8;
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>,wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            (&local_808,format_str.data_,format_str.size_,in_RCX,in_R8,0);
  fwrite(local_800,4,local_7f8,(FILE *)f);
  local_808 = &PTR_grow_00183cd0;
  if (local_800 != local_7e8) {
    operator_delete(local_800);
  }
  return;
}

Assistant:

FMT_FUNC void vprint(std::FILE *f, wstring_view format_str, wformat_args args) {
  wmemory_buffer buffer;
  internal::vformat_to(buffer, format_str, args);
  std::fwrite(buffer.data(), sizeof(wchar_t), buffer.size(), f);
}